

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

bool __thiscall
stream::slice_reader::open_file_case_insensitive
          (slice_reader *this,path_type *dirname,path_type *filename)

{
  type_conflict tVar1;
  bool bVar2;
  directory_iterator i;
  directory_iterator end;
  path_type actual_filename;
  directory_iterator local_a0;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_98;
  slice_reader *local_90;
  path_type *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  locale local_78 [8];
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98.px = (dir_itr_imp *)0x0;
  local_90 = this;
  local_88 = dirname;
  local_80 = &filename->m_pathname;
  boost::filesystem::directory_iterator::directory_iterator(&local_a0,dirname,none);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&local_a0,
                            (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&local_98), tVar1) {
    boost::filesystem::path::filename();
    std::locale::locale(local_78);
    bVar2 = boost::algorithm::iequals<std::__cxx11::string,std::__cxx11::string>
                      (&local_50,local_80,local_78);
    if (bVar2) {
      boost::filesystem::operator/((path *)local_70,local_88,(path *)&local_50);
      bVar2 = open_file(local_90,(path_type *)local_70);
      std::__cxx11::string::~string(local_70);
      std::locale::~locale(local_78);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) break;
    }
    else {
      std::locale::~locale(local_78);
      std::__cxx11::string::~string((string *)&local_50);
    }
    boost::filesystem::directory_iterator::increment(&local_a0);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_a0.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_98);
  return tVar1;
}

Assistant:

bool slice_reader::open_file_case_insensitive(const path_type & dirname, const path_type & filename) {
	
	boost::filesystem::directory_iterator end;
	for(boost::filesystem::directory_iterator i(dirname); i != end; ++i) {
		path_type actual_filename = i->path().filename();
		if(boost::iequals(actual_filename.string(), filename.string()) && open_file(dirname / actual_filename)) {
			return true;
		}
	}
	
	return false;
}